

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxTree.cpp
# Opt level: O1

void __thiscall
slang::syntax::SyntaxTree::SyntaxTree
          (SyntaxTree *this,SyntaxNode *root,SourceManager *sourceManager,BumpAllocator *alloc,
          Diagnostics *diagnostics,ParserMetadata *metadata,
          vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
          *macros,Bag *options)

{
  Info *pIVar1;
  undefined1 uVar2;
  NumericTokenFlags NVar3;
  uint32_t uVar4;
  ParserMetadata *this_00;
  
  this->isLibrary = false;
  this->rootNode = root;
  this->sourceMan = sourceManager;
  BumpAllocator::BumpAllocator(&this->alloc,alloc);
  SmallVector<slang::Diagnostic,_2UL>::SmallVector
            (&(this->diagnosticsBuffer).super_SmallVector<slang::Diagnostic,_2UL>,
             (Base *)diagnostics);
  ska::detailv3::
  sherwood_v3_table<std::pair<std::type_index,_std::any>,_std::type_index,_slang::Hasher<std::type_index>,_ska::detailv3::KeyOrValueHasher<std::type_index,_std::pair<std::type_index,_std::any>,_slang::Hasher<std::type_index>_>,_std::equal_to<std::type_index>,_ska::detailv3::KeyOrValueEquality<std::type_index,_std::pair<std::type_index,_std::any>,_std::equal_to<std::type_index>_>,_std::allocator<std::pair<std::type_index,_std::any>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::type_index,_std::any>_>_>_>
  ::sherwood_v3_table((sherwood_v3_table<std::pair<std::type_index,_std::any>,_std::type_index,_slang::Hasher<std::type_index>,_ska::detailv3::KeyOrValueHasher<std::type_index,_std::pair<std::type_index,_std::any>,_slang::Hasher<std::type_index>_>,_std::equal_to<std::type_index>,_ska::detailv3::KeyOrValueEquality<std::type_index,_std::pair<std::type_index,_std::any>,_std::equal_to<std::type_index>_>,_std::allocator<std::pair<std::type_index,_std::any>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::type_index,_std::any>_>_>_>
                       *)&this->options_,
                      (sherwood_v3_table<std::pair<std::type_index,_std::any>,_std::type_index,_slang::Hasher<std::type_index>,_ska::detailv3::KeyOrValueHasher<std::type_index,_std::pair<std::type_index,_std::any>,_slang::Hasher<std::type_index>_>,_std::equal_to<std::type_index>,_ska::detailv3::KeyOrValueEquality<std::type_index,_std::pair<std::type_index,_std::any>,_std::equal_to<std::type_index>_>,_std::allocator<std::pair<std::type_index,_std::any>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::type_index,_std::any>_>_>_>
                       *)options);
  this_00 = (ParserMetadata *)operator_new(200);
  ska::detailv3::
  sherwood_v3_table<std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_const_slang::syntax::SyntaxNode_*,_slang::Hasher<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::KeyOrValueHasher<const_slang::syntax::SyntaxNode_*,_std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::Hasher<const_slang::syntax::SyntaxNode_*>_>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::KeyOrValueEquality<const_slang::syntax::SyntaxNode_*,_std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_std::equal_to<const_slang::syntax::SyntaxNode_*>_>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>_>_>_>
  ::sherwood_v3_table((sherwood_v3_table<std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_const_slang::syntax::SyntaxNode_*,_slang::Hasher<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::KeyOrValueHasher<const_slang::syntax::SyntaxNode_*,_std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::Hasher<const_slang::syntax::SyntaxNode_*>_>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::KeyOrValueEquality<const_slang::syntax::SyntaxNode_*,_std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_std::equal_to<const_slang::syntax::SyntaxNode_*>_>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>_>_>_>
                       *)this_00,
                      (sherwood_v3_table<std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_const_slang::syntax::SyntaxNode_*,_slang::Hasher<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::KeyOrValueHasher<const_slang::syntax::SyntaxNode_*,_std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::Hasher<const_slang::syntax::SyntaxNode_*>_>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::KeyOrValueEquality<const_slang::syntax::SyntaxNode_*,_std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_std::equal_to<const_slang::syntax::SyntaxNode_*>_>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>_>_>_>
                       *)metadata);
  ska::detailv3::
  sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  ::sherwood_v3_table(&(this_00->globalInstances).
                       super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                      ,&(metadata->globalInstances).
                        super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                     );
  *(pointer *)
   &(this_00->classPackageNames).
    super__Vector_base<const_slang::syntax::IdentifierNameSyntax_*,_std::allocator<const_slang::syntax::IdentifierNameSyntax_*>_>
    ._M_impl = (metadata->classPackageNames).
               super__Vector_base<const_slang::syntax::IdentifierNameSyntax_*,_std::allocator<const_slang::syntax::IdentifierNameSyntax_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&(this_00->classPackageNames).
           super__Vector_base<const_slang::syntax::IdentifierNameSyntax_*,_std::allocator<const_slang::syntax::IdentifierNameSyntax_*>_>
   + 8) = (metadata->classPackageNames).
          super__Vector_base<const_slang::syntax::IdentifierNameSyntax_*,_std::allocator<const_slang::syntax::IdentifierNameSyntax_*>_>
          ._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)
   ((long)&(this_00->classPackageNames).
           super__Vector_base<const_slang::syntax::IdentifierNameSyntax_*,_std::allocator<const_slang::syntax::IdentifierNameSyntax_*>_>
   + 0x10) = (metadata->classPackageNames).
             super__Vector_base<const_slang::syntax::IdentifierNameSyntax_*,_std::allocator<const_slang::syntax::IdentifierNameSyntax_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (metadata->classPackageNames).
  super__Vector_base<const_slang::syntax::IdentifierNameSyntax_*,_std::allocator<const_slang::syntax::IdentifierNameSyntax_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (metadata->classPackageNames).
  super__Vector_base<const_slang::syntax::IdentifierNameSyntax_*,_std::allocator<const_slang::syntax::IdentifierNameSyntax_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (metadata->classPackageNames).
  super__Vector_base<const_slang::syntax::IdentifierNameSyntax_*,_std::allocator<const_slang::syntax::IdentifierNameSyntax_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(pointer *)
   &(this_00->packageImports).
    super__Vector_base<const_slang::syntax::PackageImportDeclarationSyntax_*,_std::allocator<const_slang::syntax::PackageImportDeclarationSyntax_*>_>
    ._M_impl = (metadata->packageImports).
               super__Vector_base<const_slang::syntax::PackageImportDeclarationSyntax_*,_std::allocator<const_slang::syntax::PackageImportDeclarationSyntax_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&(this_00->packageImports).
           super__Vector_base<const_slang::syntax::PackageImportDeclarationSyntax_*,_std::allocator<const_slang::syntax::PackageImportDeclarationSyntax_*>_>
   + 8) = (metadata->packageImports).
          super__Vector_base<const_slang::syntax::PackageImportDeclarationSyntax_*,_std::allocator<const_slang::syntax::PackageImportDeclarationSyntax_*>_>
          ._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)
   ((long)&(this_00->packageImports).
           super__Vector_base<const_slang::syntax::PackageImportDeclarationSyntax_*,_std::allocator<const_slang::syntax::PackageImportDeclarationSyntax_*>_>
   + 0x10) = (metadata->packageImports).
             super__Vector_base<const_slang::syntax::PackageImportDeclarationSyntax_*,_std::allocator<const_slang::syntax::PackageImportDeclarationSyntax_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (metadata->packageImports).
  super__Vector_base<const_slang::syntax::PackageImportDeclarationSyntax_*,_std::allocator<const_slang::syntax::PackageImportDeclarationSyntax_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (metadata->packageImports).
  super__Vector_base<const_slang::syntax::PackageImportDeclarationSyntax_*,_std::allocator<const_slang::syntax::PackageImportDeclarationSyntax_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (metadata->packageImports).
  super__Vector_base<const_slang::syntax::PackageImportDeclarationSyntax_*,_std::allocator<const_slang::syntax::PackageImportDeclarationSyntax_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(pointer *)
   &(this_00->defparams).
    super__Vector_base<const_slang::syntax::DefParamSyntax_*,_std::allocator<const_slang::syntax::DefParamSyntax_*>_>
    ._M_impl = (metadata->defparams).
               super__Vector_base<const_slang::syntax::DefParamSyntax_*,_std::allocator<const_slang::syntax::DefParamSyntax_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&(this_00->defparams).
           super__Vector_base<const_slang::syntax::DefParamSyntax_*,_std::allocator<const_slang::syntax::DefParamSyntax_*>_>
   + 8) = (metadata->defparams).
          super__Vector_base<const_slang::syntax::DefParamSyntax_*,_std::allocator<const_slang::syntax::DefParamSyntax_*>_>
          ._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)
   ((long)&(this_00->defparams).
           super__Vector_base<const_slang::syntax::DefParamSyntax_*,_std::allocator<const_slang::syntax::DefParamSyntax_*>_>
   + 0x10) = (metadata->defparams).
             super__Vector_base<const_slang::syntax::DefParamSyntax_*,_std::allocator<const_slang::syntax::DefParamSyntax_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (metadata->defparams).
  super__Vector_base<const_slang::syntax::DefParamSyntax_*,_std::allocator<const_slang::syntax::DefParamSyntax_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (metadata->defparams).
  super__Vector_base<const_slang::syntax::DefParamSyntax_*,_std::allocator<const_slang::syntax::DefParamSyntax_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (metadata->defparams).
  super__Vector_base<const_slang::syntax::DefParamSyntax_*,_std::allocator<const_slang::syntax::DefParamSyntax_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(pointer *)
   &(this_00->classDecls).
    super__Vector_base<const_slang::syntax::ClassDeclarationSyntax_*,_std::allocator<const_slang::syntax::ClassDeclarationSyntax_*>_>
    ._M_impl = (metadata->classDecls).
               super__Vector_base<const_slang::syntax::ClassDeclarationSyntax_*,_std::allocator<const_slang::syntax::ClassDeclarationSyntax_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&(this_00->classDecls).
           super__Vector_base<const_slang::syntax::ClassDeclarationSyntax_*,_std::allocator<const_slang::syntax::ClassDeclarationSyntax_*>_>
   + 8) = (metadata->classDecls).
          super__Vector_base<const_slang::syntax::ClassDeclarationSyntax_*,_std::allocator<const_slang::syntax::ClassDeclarationSyntax_*>_>
          ._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)
   ((long)&(this_00->classDecls).
           super__Vector_base<const_slang::syntax::ClassDeclarationSyntax_*,_std::allocator<const_slang::syntax::ClassDeclarationSyntax_*>_>
   + 0x10) = (metadata->classDecls).
             super__Vector_base<const_slang::syntax::ClassDeclarationSyntax_*,_std::allocator<const_slang::syntax::ClassDeclarationSyntax_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (metadata->classDecls).
  super__Vector_base<const_slang::syntax::ClassDeclarationSyntax_*,_std::allocator<const_slang::syntax::ClassDeclarationSyntax_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (metadata->classDecls).
  super__Vector_base<const_slang::syntax::ClassDeclarationSyntax_*,_std::allocator<const_slang::syntax::ClassDeclarationSyntax_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (metadata->classDecls).
  super__Vector_base<const_slang::syntax::ClassDeclarationSyntax_*,_std::allocator<const_slang::syntax::ClassDeclarationSyntax_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(pointer *)
   &(this_00->bindDirectives).
    super__Vector_base<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>
    ._M_impl = (metadata->bindDirectives).
               super__Vector_base<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&(this_00->bindDirectives).
           super__Vector_base<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>
   + 8) = (metadata->bindDirectives).
          super__Vector_base<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>
          ._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)
   ((long)&(this_00->bindDirectives).
           super__Vector_base<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>
   + 0x10) = (metadata->bindDirectives).
             super__Vector_base<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (metadata->bindDirectives).
  super__Vector_base<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (metadata->bindDirectives).
  super__Vector_base<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (metadata->bindDirectives).
  super__Vector_base<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar2 = (metadata->eofToken).field_0x2;
  NVar3.raw = (metadata->eofToken).numFlags.raw;
  uVar4 = (metadata->eofToken).rawLen;
  pIVar1 = (metadata->eofToken).info;
  (this_00->eofToken).kind = (metadata->eofToken).kind;
  (this_00->eofToken).field_0x2 = uVar2;
  (this_00->eofToken).numFlags = (NumericTokenFlags)NVar3.raw;
  (this_00->eofToken).rawLen = uVar4;
  (this_00->eofToken).info = pIVar1;
  (this->metadata)._M_t.
  super___uniq_ptr_impl<slang::parsing::ParserMetadata,_std::default_delete<slang::parsing::ParserMetadata>_>
  ._M_t.
  super__Tuple_impl<0UL,_slang::parsing::ParserMetadata_*,_std::default_delete<slang::parsing::ParserMetadata>_>
  .super__Head_base<0UL,_slang::parsing::ParserMetadata_*,_false>._M_head_impl = this_00;
  (this->macros).
  super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (macros->
       super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->macros).
  super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (macros->
       super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  (this->macros).
  super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (macros->
       super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (macros->
  super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (macros->
  super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (macros->
  super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->parentTree).super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->parentTree).super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return;
}

Assistant:

SyntaxTree::SyntaxTree(SyntaxNode* root, SourceManager& sourceManager, BumpAllocator&& alloc,
                       Diagnostics&& diagnostics, ParserMetadata&& metadata,
                       std::vector<const DefineDirectiveSyntax*>&& macros, Bag options) :
    rootNode(root),
    sourceMan(sourceManager), alloc(std::move(alloc)), diagnosticsBuffer(std::move(diagnostics)),
    options_(std::move(options)), metadata(std::make_unique<ParserMetadata>(std::move(metadata))),
    macros(std::move(macros)) {
}